

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_value.h
# Opt level: O0

indirect_value<int,_EmptyYes_FinalNo,_EmptyYes_FinalNo> * __thiscall
isocpp_p1950::indirect_value<int,_EmptyYes_FinalNo,_EmptyYes_FinalNo>::operator=
          (indirect_value<int,_EmptyYes_FinalNo,_EmptyYes_FinalNo> *this,
          indirect_value<int,_EmptyYes_FinalNo,_EmptyYes_FinalNo> *i)

{
  int *piVar1;
  void *local_20;
  indirect_value_copy_base<EmptyYes_FinalNo,_true> *local_18;
  indirect_value<int,_EmptyYes_FinalNo,_EmptyYes_FinalNo> *i_local;
  indirect_value<int,_EmptyYes_FinalNo,_EmptyYes_FinalNo> *this_local;
  
  if (this != i) {
    local_18 = (indirect_value_copy_base<EmptyYes_FinalNo,_true> *)i;
    i_local = this;
    reset(this);
    indirect_value_copy_base<EmptyYes_FinalNo,_true>::operator=
              ((indirect_value_copy_base<EmptyYes_FinalNo,_true> *)this,local_18);
    indirect_value_delete_base<EmptyYes_FinalNo,_true>::operator=
              ((indirect_value_delete_base<EmptyYes_FinalNo,_true> *)((long)&this->ptr_ + 1),
               (indirect_value_delete_base<EmptyYes_FinalNo,_true> *)(local_18 + 1));
    local_20 = (void *)0x0;
    piVar1 = std::exchange<int*,decltype(nullptr)>((int **)local_18,&local_20);
    this->ptr_ = piVar1;
  }
  return this;
}

Assistant:

constexpr indirect_value& operator=(indirect_value&& i) noexcept {
    if (this != &i) {
      reset();
      copy_base::operator=(std::move(i));
      delete_base::operator=(std::move(i));
      ptr_ = std::exchange(i.ptr_, nullptr);
    }
    return *this;
  }